

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_tests.cpp
# Opt level: O0

void __thiscall
omp_enumerate_values_from_zero_case_Test::TestBody(omp_enumerate_values_from_zero_case_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  type *lhs;
  char *message;
  enumerate<std::vector<int,_std::allocator<int>_>_&> eVar2;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  int *value;
  type *idx;
  pair<const_long,_int_&> *local_c0;
  undefined1 local_b8 [8];
  iterator __end1;
  iterator __begin1;
  enumerate<std::vector<int,_std::allocator<int>_>_&> *__range1;
  allocator<int> local_69;
  int local_68 [12];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> expecting;
  omp_enumerate_values_from_zero_case_Test *this_local;
  
  local_68[8] = 8;
  local_68[9] = 9;
  local_68[4] = 4;
  local_68[5] = 5;
  local_68[6] = 6;
  local_68[7] = 7;
  local_68[0] = 0;
  local_68[1] = 1;
  local_68[2] = 2;
  local_68[3] = 3;
  local_38 = local_68;
  local_30 = 10;
  expecting.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_69);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_69);
  std::allocator<int>::~allocator(&local_69);
  eVar2 = omp::enumerate<std::vector<int,std::allocator<int>>&>
                    ((vector<int,_std::allocator<int>_> *)local_28,0);
  __begin1.value_ = eVar2.start_;
  join_0x00000010_0x00000000_ =
       omp::details::enumerate<std::vector<int,_std::allocator<int>_>_&>::begin
                 ((enumerate<std::vector<int,_std::allocator<int>_>_&> *)&__begin1.value_);
  _local_b8 = omp::details::enumerate<std::vector<int,_std::allocator<int>_>_&>::end
                        ((enumerate<std::vector<int,_std::allocator<int>_>_&> *)&__begin1.value_);
  while (bVar1 = omp::details::
                 enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator!=((enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                               *)&__end1.value_,
                              (enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                               *)local_b8), bVar1) {
    _idx = omp::details::
           enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           ::operator*((enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)&__end1.value_);
    local_c0 = (pair<const_long,_int_&> *)&idx;
    lhs = std::get<0ul,long_const,int&>(local_c0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::get<1ul,long_const,int&>(local_c0);
    testing::internal::EqHelper::Compare<long,_int,_nullptr>
              ((EqHelper *)local_f0,"idx","value",lhs,
               (int *)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/enumerate_tests.cpp"
                 ,0x79,message);
      testing::internal::AssertHelper::operator=(&local_100,&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      testing::Message::~Message(&local_f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (!bVar1) break;
    omp::details::
    enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++((enumerate_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                  *)&__end1.value_);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(omp_enumerate, values_from_zero_case) {
  std::vector expecting = {0, 1, 2, 3, 4, 5, 6, 7, 8, 9};

  for (auto &[idx, value] : omp::enumerate(expecting))
    ASSERT_EQ(idx, value);
}